

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

int * __thiscall
google::protobuf::RepeatedField<int>::elements(RepeatedField<int> *this,bool is_soo)

{
  uint uVar1;
  int *piVar2;
  size_t sVar3;
  ostream *poVar4;
  char *extraout_RDX;
  undefined7 in_register_00000031;
  undefined1 *puVar5;
  ulong *puVar6;
  char *__s;
  CheckOpMessageBuilder aCStack_1c0 [112];
  ios_base aiStack_150 [264];
  char acStack_28 [8];
  code *pcStack_20;
  undefined1 local_10 [16];
  
  uVar1 = 2;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    uVar1 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (0 < (int)uVar1) {
    if (is_soo) {
      return (int *)((long)&(this->soo_rep_).field_0 + 8);
    }
    piVar2 = (int *)internal::LongSooRep::elements((LongSooRep *)this);
    return piVar2;
  }
  puVar5 = local_10;
  puVar6 = (ulong *)(ulong)uVar1;
  pcStack_20 = internal::LongSooRep::elements;
  elements();
  if ((int *)(*puVar6 & 0xfffffffffffffff8) != (int *)0x0) {
    return (int *)(*puVar6 & 0xfffffffffffffff8);
  }
  __s = acStack_28;
  internal::LongSooRep::elements();
  absl::lts_20240722::log_internal::CheckOpMessageBuilder::CheckOpMessageBuilder
            (aCStack_1c0,extraout_RDX);
  if (__s == (char *)0x0) {
    __s = (char *)&absl::lts_20240722::log_internal::kCharNull;
  }
  sVar3 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aCStack_1c0,__s,sVar3);
  poVar4 = (ostream *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::ForVar2();
  absl::lts_20240722::log_internal::MakeCheckOpValueString(poVar4,puVar5);
  piVar2 = (int *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::NewString_abi_cxx11_();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)aCStack_1c0);
  std::ios_base::~ios_base(aiStack_150);
  return piVar2;
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }